

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O1

double __thiscall tri_cc_geom_t::get_tri_area(tri_cc_geom_t *this,cellid_t c)

{
  double *pdVar1;
  tri_cc_t *ptVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  ostream *poVar7;
  runtime_error *this_00;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  cellid_t pts [20];
  string asStack_1c8 [32];
  int local_1a8;
  int local_1a4;
  int local_1a0;
  ostream local_198 [384];
  
  ptVar2 = (this->m_tri_cc).px;
  if (ptVar2 != (tri_cc_t *)0x0) {
    uVar6 = tri_cc_t::get_cell_dim(ptVar2,c);
    if (uVar6 != 2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,"Failed to assert condition ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"get_cell_dim(c) == 2",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"at (",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                 ,0x60);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"get_tri_area",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,",",1);
      poVar7 = (ostream *)std::ostream::operator<<(local_198,0x27d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") \n ",4);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,asStack_1c8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ptVar2 = (this->m_tri_cc).px;
    if (ptVar2 != (tri_cc_t *)0x0) {
      tri_cc_t::get_cell_points(ptVar2,c,&local_1a8);
      lVar3 = *(long *)&this->m_cell_pos;
      pdVar1 = (double *)(lVar3 + (long)local_1a8 * 0x18);
      dVar4 = *pdVar1;
      dVar5 = pdVar1[1];
      pdVar1 = (double *)(lVar3 + (long)local_1a4 * 0x18);
      dVar13 = *pdVar1;
      dVar14 = pdVar1[1];
      dVar9 = dVar4 - dVar13;
      dVar12 = dVar5 - dVar14;
      dVar8 = *(double *)(lVar3 + 0x10 + (long)local_1a8 * 0x18);
      dVar15 = *(double *)(lVar3 + 0x10 + (long)local_1a4 * 0x18);
      dVar10 = dVar8 - dVar15;
      dVar11 = SQRT(dVar10 * dVar10 + dVar12 * dVar12 + dVar9 * dVar9);
      pdVar1 = (double *)(lVar3 + (long)local_1a0 * 0x18);
      dVar10 = *pdVar1;
      dVar12 = pdVar1[1];
      dVar13 = dVar13 - dVar10;
      dVar14 = dVar14 - dVar12;
      dVar9 = *(double *)(lVar3 + 0x10 + (long)local_1a0 * 0x18);
      dVar15 = dVar15 - dVar9;
      dVar13 = SQRT(dVar15 * dVar15 + dVar14 * dVar14 + dVar13 * dVar13);
      dVar10 = dVar10 - dVar4;
      dVar12 = dVar12 - dVar5;
      dVar9 = dVar9 - dVar8;
      dVar15 = SQRT(dVar9 * dVar9 + dVar12 * dVar12 + dVar10 * dVar10);
      dVar8 = (dVar11 + dVar13 + dVar15) * 0.5;
      dVar8 = (dVar8 - dVar15) * (dVar8 - dVar13) * (dVar8 - dVar11) * dVar8;
      if (0.0 <= dVar8) {
        return SQRT(dVar8);
      }
      dVar8 = sqrt(dVar8);
      return dVar8;
    }
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<tri_cc_t>::operator->() const [T = tri_cc_t]"
               );
}

Assistant:

double tri_cc_geom_t::get_tri_area(cellid_t c) const
{
  ASSERT(get_cell_dim(c) == 2);

  cellid_t pts[20];

  get_cell_points(c,pts);

  return la::tri_area<double,3>
      (m_cell_pos[pts[0]],m_cell_pos[pts[1]],m_cell_pos[pts[2]]);
}